

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::SetVertexBuffers
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,Uint32 StartSlot,
          Uint32 NumBuffersSet,IBuffer **ppBuffers,Uint64 *pOffsets,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode,SET_VERTEX_BUFFERS_FLAGS Flags)

{
  String *__return_storage_ptr__;
  uint uVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  SET_VERTEX_BUFFERS_FLAGS SVar4;
  BIND_FLAGS BVar5;
  Char *pCVar6;
  RenderPassVkImpl *pRVar7;
  uint *puVar8;
  RefCntAutoPtr *this_00;
  BufferVkImpl *this_01;
  COMMAND_QUEUE_TYPE Type;
  undefined7 in_register_00000089;
  char (*Args_3) [8];
  char (*in_stack_fffffffffffffdd8) [46];
  char (*in_stack_fffffffffffffde8) [3];
  bool local_209;
  char *local_200;
  Uint64 local_1f8;
  BufferVkImpl *local_1f0;
  VertexStreamInfo<Diligent::BufferVkImpl> local_1b0;
  char *local_1a0;
  undefined1 local_198 [8];
  string msg_6;
  BufferDesc *BuffDesc;
  VertexStreamInfo<Diligent::BufferVkImpl> *CurrStream;
  Uint32 Buff;
  uint local_14c;
  undefined1 local_148 [4];
  Uint32 s_1;
  uint local_134;
  undefined1 local_130 [4];
  Uint32 s;
  string msg_5;
  undefined1 local_108 [8];
  string msg_4;
  undefined1 local_e0 [8];
  string msg_3;
  undefined1 local_a0 [8];
  string msg_2;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  RESOURCE_STATE_TRANSITION_MODE StateTransitionMode_local;
  Uint64 *pOffsets_local;
  IBuffer **ppBuffers_local;
  Uint32 NumBuffersSet_local;
  Uint32 StartSlot_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  Args_3 = (char (*) [8])CONCAT71(in_register_00000089,Flags);
  msg.field_2._M_local_buf[0xf] = StateTransitionMode;
  ppBuffers_local._0_4_ = NumBuffersSet;
  ppBuffers_local._4_4_ = StartSlot;
  _NumBuffersSet_local = this;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar2 = IsDeferred(this);
    if (!bVar2) {
      FormatString<char[79]>
                ((string *)local_50,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"SetVertexBuffers",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x2d2);
      std::__cxx11::string::~string((string *)local_50);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d2);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar3 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
  if (CVar3 != COMMAND_QUEUE_TYPE_GRAPHICS) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    FormatString<char[17],char[22],std::__cxx11::string,char[8]>
              ((string *)local_a0,(Diligent *)"SetVertexBuffers",(char (*) [17])0xcc2999,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",Args_3
              );
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d2);
    std::__cxx11::string::~string((string *)local_a0);
  }
  if (0x1f < ppBuffers_local._4_4_) {
    msg_4.field_2._12_4_ = 0x1f;
    FormatString<char[26],unsigned_int,char[30],unsigned_int,char[3]>
              ((string *)local_e0,(Diligent *)"Start vertex buffer slot ",
               (char (*) [26])((long)&ppBuffers_local + 4),(uint *)0xccca71,
               (char (*) [30])((long)&msg_4.field_2 + 0xc),(uint *)0xc12bdb,
               (char (*) [3])in_stack_fffffffffffffdd8);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d4);
    std::__cxx11::string::~string((string *)local_e0);
  }
  if (0x20 < ppBuffers_local._4_4_ + (Uint32)ppBuffers_local) {
    msg_5.field_2._12_4_ = (ppBuffers_local._4_4_ - 1) + (Uint32)ppBuffers_local;
    msg_5.field_2._8_4_ = 0x1f;
    in_stack_fffffffffffffdd8 = (char (*) [46])((long)&msg_5.field_2 + 8);
    FormatString<char[45],unsigned_int,char[3],unsigned_int,char[32],unsigned_int,char[3]>
              ((string *)local_108,(Diligent *)"The range of vertex buffer slots being set [",
               (char (*) [45])((long)&ppBuffers_local + 4),(uint *)0xd26306,
               (char (*) [3])((long)&msg_5.field_2 + 0xc),(uint *)"] is out of allowed range  [0, ",
               (char (*) [32])in_stack_fffffffffffffdd8,(uint *)0xc12bdb,in_stack_fffffffffffffde8);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2d8);
    std::__cxx11::string::~string((string *)local_108);
  }
  pRVar7 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
  if ((pRVar7 != (RenderPassVkImpl *)0x0) && (msg.field_2._M_local_buf[0xf] == '\x01')) {
    FormatString<char[188]>
              ((string *)local_130,
               (char (*) [188])
               "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first."
              );
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"SetVertexBuffers",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x2dc);
    std::__cxx11::string::~string((string *)local_130);
  }
  SVar4 = Diligent::operator&(Flags,SET_VERTEX_BUFFERS_FLAG_RESET);
  if (SVar4 != SET_VERTEX_BUFFERS_FLAG_NONE) {
    for (local_134 = 0; local_134 < ppBuffers_local._4_4_; local_134 = local_134 + 1) {
      VertexStreamInfo<Diligent::BufferVkImpl>::VertexStreamInfo
                ((VertexStreamInfo<Diligent::BufferVkImpl> *)local_148);
      VertexStreamInfo<Diligent::BufferVkImpl>::operator=
                (this->m_VertexStreams + local_134,
                 (VertexStreamInfo<Diligent::BufferVkImpl> *)local_148);
      VertexStreamInfo<Diligent::BufferVkImpl>::~VertexStreamInfo
                ((VertexStreamInfo<Diligent::BufferVkImpl> *)local_148);
    }
    for (local_14c = ppBuffers_local._4_4_ + (Uint32)ppBuffers_local;
        local_14c < this->m_NumVertexStreams; local_14c = local_14c + 1) {
      VertexStreamInfo<Diligent::BufferVkImpl>::VertexStreamInfo
                ((VertexStreamInfo<Diligent::BufferVkImpl> *)&Buff);
      VertexStreamInfo<Diligent::BufferVkImpl>::operator=
                (this->m_VertexStreams + local_14c,(VertexStreamInfo<Diligent::BufferVkImpl> *)&Buff
                );
      VertexStreamInfo<Diligent::BufferVkImpl>::~VertexStreamInfo
                ((VertexStreamInfo<Diligent::BufferVkImpl> *)&Buff);
    }
    this->m_NumVertexStreams = 0;
  }
  CurrStream._4_4_ = ppBuffers_local._4_4_ + (Uint32)ppBuffers_local;
  puVar8 = std::max<unsigned_int>(&this->m_NumVertexStreams,(uint *)((long)&CurrStream + 4));
  this->m_NumVertexStreams = *puVar8;
  for (CurrStream._0_4_ = 0; (uint)CurrStream < (Uint32)ppBuffers_local;
      CurrStream._0_4_ = (uint)CurrStream + 1) {
    this_00 = (RefCntAutoPtr *)(this->m_VertexStreams + (ppBuffers_local._4_4_ + (uint)CurrStream));
    if (ppBuffers == (IBuffer **)0x0) {
      local_1f0 = (BufferVkImpl *)0x0;
    }
    else {
      local_1f0 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>
                            (ppBuffers[(uint)CurrStream]);
    }
    RefCntAutoPtr<Diligent::BufferVkImpl>::operator=
              ((RefCntAutoPtr<Diligent::BufferVkImpl> *)this_00,local_1f0);
    if (pOffsets == (Uint64 *)0x0) {
      local_1f8 = 0;
    }
    else {
      local_1f8 = pOffsets[(uint)CurrStream];
    }
    *(Uint64 *)(this_00 + 8) = local_1f8;
    bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool(this_00);
    if (bVar2) {
      this_01 = RefCntAutoPtr<Diligent::BufferVkImpl>::operator->
                          ((RefCntAutoPtr<Diligent::BufferVkImpl> *)this_00);
      msg_6.field_2._8_8_ =
           DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                      *)this_01);
      BVar5 = Diligent::operator&(((BufferDesc *)msg_6.field_2._8_8_)->BindFlags,BIND_VERTEX_BUFFER)
      ;
      if (BVar5 == BIND_NONE) {
        if (*(long *)msg_6.field_2._8_8_ == 0) {
          local_200 = "";
        }
        else {
          local_200 = *(char **)msg_6.field_2._8_8_;
        }
        local_1a0 = local_200;
        FormatString<char[9],char_const*,char[40],unsigned_int,char[46]>
                  ((string *)local_198,(Diligent *)0xc0c559,(char (*) [9])&local_1a0,
                   (char **)"\' being bound as vertex buffer to slot ",(char (*) [40])&CurrStream,
                   (uint *)" was not created with BIND_VERTEX_BUFFER flag",in_stack_fffffffffffffdd8
                  );
        pCVar6 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar6,"SetVertexBuffers",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x2f6);
        std::__cxx11::string::~string((string *)local_198);
      }
    }
  }
  while( true ) {
    local_209 = false;
    if (this->m_NumVertexStreams != 0) {
      local_209 = RefCntAutoPtr<Diligent::BufferVkImpl>::operator!
                            (&this->m_VertexStreams[this->m_NumVertexStreams - 1].pBuffer);
    }
    if (local_209 == false) break;
    VertexStreamInfo<Diligent::BufferVkImpl>::VertexStreamInfo(&local_1b0);
    uVar1 = this->m_NumVertexStreams;
    this->m_NumVertexStreams = uVar1 - 1;
    VertexStreamInfo<Diligent::BufferVkImpl>::operator=(this->m_VertexStreams + uVar1,&local_1b0);
    VertexStreamInfo<Diligent::BufferVkImpl>::~VertexStreamInfo(&local_1b0);
  }
  (this->m_Stats).CommandCounters.SetVertexBuffers =
       (this->m_Stats).CommandCounters.SetVertexBuffers + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::SetVertexBuffers(
    Uint32                         StartSlot,
    Uint32                         NumBuffersSet,
    IBuffer* const*                ppBuffers,
    const Uint64*                  pOffsets,
    RESOURCE_STATE_TRANSITION_MODE StateTransitionMode,
    SET_VERTEX_BUFFERS_FLAGS       Flags)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "SetVertexBuffers");

    DEV_CHECK_ERR(StartSlot < MAX_BUFFER_SLOTS, "Start vertex buffer slot ", StartSlot, " is out of allowed range [0, ", MAX_BUFFER_SLOTS - 1, "].");

    DEV_CHECK_ERR(StartSlot + NumBuffersSet <= MAX_BUFFER_SLOTS,
                  "The range of vertex buffer slots being set [", StartSlot, ", ", StartSlot + NumBuffersSet - 1,
                  "] is out of allowed range  [0, ", MAX_BUFFER_SLOTS - 1, "].");

    DEV_CHECK_ERR(!(m_pActiveRenderPass != nullptr && StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION),
                  "Resource state transitions are not allowed inside a render pass and may result in an undefined behavior. "
                  "Do not use RESOURCE_STATE_TRANSITION_MODE_TRANSITION or end the render pass first.");

    if (Flags & SET_VERTEX_BUFFERS_FLAG_RESET)
    {
        // Reset only these buffer slots that are not being set.
        // It is very important to not reset buffers that stay unchanged
        // as AddRef()/Release() are not free
        for (Uint32 s = 0; s < StartSlot; ++s)
            m_VertexStreams[s] = VertexStreamInfo<BufferImplType>{};
        for (Uint32 s = StartSlot + NumBuffersSet; s < m_NumVertexStreams; ++s)
            m_VertexStreams[s] = VertexStreamInfo<BufferImplType>{};
        m_NumVertexStreams = 0;
    }
    m_NumVertexStreams = (std::max)(m_NumVertexStreams, StartSlot + NumBuffersSet);

    for (Uint32 Buff = 0; Buff < NumBuffersSet; ++Buff)
    {
        VertexStreamInfo<BufferImplType>& CurrStream{m_VertexStreams[StartSlot + Buff]};
        CurrStream.pBuffer = ppBuffers ? ClassPtrCast<BufferImplType>(ppBuffers[Buff]) : nullptr;
        CurrStream.Offset  = pOffsets ? pOffsets[Buff] : 0;
#ifdef DILIGENT_DEVELOPMENT
        if (CurrStream.pBuffer)
        {
            const BufferDesc& BuffDesc = CurrStream.pBuffer->GetDesc();
            DEV_CHECK_ERR((BuffDesc.BindFlags & BIND_VERTEX_BUFFER) != 0,
                          "Buffer '", BuffDesc.Name ? BuffDesc.Name : "", "' being bound as vertex buffer to slot ", Buff,
                          " was not created with BIND_VERTEX_BUFFER flag");
        }
#endif
    }
    // Remove null buffers from the end of the array
    while (m_NumVertexStreams > 0 && !m_VertexStreams[m_NumVertexStreams - 1].pBuffer)
        m_VertexStreams[m_NumVertexStreams--] = VertexStreamInfo<BufferImplType>{};

    ++m_Stats.CommandCounters.SetVertexBuffers;
}